

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hpp
# Opt level: O1

void __thiscall
generator::tag_b_t<cfgfile::string_trait_t>::set_cfg
          (tag_b_t<cfgfile::string_trait_t> *this,b_t *cfg)

{
  string_t *psVar1;
  tag_a_t<cfgfile::string_trait_t> *this_00;
  string_t *v;
  ptr_to_tag_t p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  value_type local_68;
  string_t local_58;
  vector_of_tags_t *local_38;
  
  cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::set_value
            (&this->super_tag_scalar_t<int,_cfgfile::string_trait_t>,&cfg->m_integer_field);
  v = &((cfg->m_a_vector).super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>.
        _M_impl.super__Vector_impl_data._M_start)->m_string_field;
  psVar1 = &((cfg->m_a_vector).super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>.
             _M_impl.super__Vector_impl_data._M_finish)->m_string_field;
  if (v != psVar1) {
    local_38 = &(this->m_a_vector).m_tags;
    do {
      this_00 = (tag_a_t<cfgfile::string_trait_t> *)operator_new(0xe8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"a_vector","");
      tag_a_t<cfgfile::string_trait_t>::tag_a_t(this_00,&local_58,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<generator::tag_a_t<cfgfile::string_trait_t>*>(&local_70,this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      cfgfile::
      tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
      ::set_value(&this_00->m_string_field,v);
      (this_00->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
      m_is_defined = true;
      local_68.
      super___shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_70._M_pi;
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
        }
      }
      local_68.
      super___shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = this_00;
      std::
      vector<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>_>_>_>
      ::push_back(local_38,&local_68);
      (this->m_a_vector).super_tag_t<cfgfile::string_trait_t>.m_is_defined = true;
      if (local_68.
          super___shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.
                   super___shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
      }
      v = v + 1;
    } while (v != psVar1);
  }
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_defined = true;
  return;
}

Assistant:

void set_cfg( const b_t & cfg )
	{
		this->set_value( cfg.integer_field() );

		for( const generator::a_t & v : cfg.a_vector() )
		{
			typename cfgfile::tag_vector_of_tags_t< generator::tag_a_t< Trait >, Trait >::ptr_to_tag_t p(
				new generator::tag_a_t< Trait >( "a_vector", false ) );

			p->set_cfg( v );

			m_a_vector.set_value( p );
		}

		this->set_defined();
	}